

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureFormatTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles2::Functional::Compressed2DFormatCase::iterate(Compressed2DFormatCase *this)

{
  code *pcVar1;
  RenderContext *context;
  bool bVar2;
  int iVar3;
  int preferredWidth;
  int preferredHeight;
  deUint32 dVar4;
  RGBA threshold_00;
  undefined4 extraout_var;
  TestLog *log_00;
  undefined4 extraout_var_00;
  Texture2D *pTVar6;
  char *pcVar7;
  undefined4 extraout_var_01;
  PixelFormat *pPVar8;
  reference pvVar9;
  undefined4 extraout_var_02;
  Texture2DView TVar10;
  undefined1 local_1d8 [7];
  bool isOk;
  ConstPixelBufferAccess *local_1d0;
  SurfaceAccess local_1c8;
  Vector<float,_4> local_1a8;
  Sampler local_198;
  undefined1 local_15c [8];
  ReferenceParams refParams;
  Vector<float,_2> local_a0;
  Vector<float,_2> local_98;
  undefined1 local_90 [8];
  vector<float,_std::allocator<float>_> texCoord;
  RGBA threshold;
  undefined1 local_60 [8];
  Surface referenceFrame;
  Surface renderedFrame;
  RandomViewport viewport;
  TestLog *log;
  Functions *gl;
  Compressed2DFormatCase *this_local;
  long lVar5;
  
  iVar3 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar3);
  log_00 = tcu::TestContext::getLog((this->super_TestCase).super_TestNode.m_testCtx);
  iVar3 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  pTVar6 = glu::Texture2D::getRefTexture(this->m_texture);
  preferredWidth = tcu::Texture2D::getWidth(pTVar6);
  pTVar6 = glu::Texture2D::getRefTexture(this->m_texture);
  preferredHeight = tcu::Texture2D::getHeight(pTVar6);
  pcVar7 = tcu::TestNode::getName((TestNode *)this);
  dVar4 = deStringHash(pcVar7);
  deqp::gls::TextureTestUtil::RandomViewport::RandomViewport
            ((RandomViewport *)&renderedFrame.m_pixels.m_cap,
             (RenderTarget *)CONCAT44(extraout_var_00,iVar3),preferredWidth,preferredHeight,dVar4);
  tcu::Surface::Surface((Surface *)&referenceFrame.m_pixels.m_cap,viewport.x,viewport.y);
  tcu::Surface::Surface((Surface *)local_60,viewport.x,viewport.y);
  iVar3 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  pPVar8 = tcu::RenderTarget::getPixelFormat((RenderTarget *)CONCAT44(extraout_var_01,iVar3));
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = tcu::PixelFormat::getColorThreshold(pPVar8);
  tcu::RGBA::RGBA((RGBA *)&texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,1,1,1,1);
  threshold_00 = tcu::operator+((RGBA *)((long)&texCoord.
                                                super__Vector_base<float,_std::allocator<float>_>.
                                                _M_impl.super__Vector_impl_data._M_end_of_storage +
                                        4),
                                (RGBA *)&texCoord.super__Vector_base<float,_std::allocator<float>_>.
                                         _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_90);
  tcu::Vector<float,_2>::Vector(&local_98,0.0,0.0);
  tcu::Vector<float,_2>::Vector(&local_a0,1.0,1.0);
  glu::TextureTestUtil::computeQuadTexCoord2D
            ((vector<float,_std::allocator<float>_> *)local_90,&local_98,&local_a0);
  (**(code **)(lVar5 + 0x1a00))
            ((int)renderedFrame.m_pixels.m_cap,renderedFrame.m_pixels.m_cap._4_4_,viewport.x,
             viewport.y);
  (**(code **)(lVar5 + 8))(0x84c0);
  pcVar1 = *(code **)(lVar5 + 0xb8);
  dVar4 = glu::Texture2D::getGLTexture(this->m_texture);
  (*pcVar1)(0xde1,dVar4);
  (**(code **)(lVar5 + 0x1360))(0xde1,0x2802,0x812f);
  (**(code **)(lVar5 + 0x1360))(0xde1,0x2803,0x812f);
  (**(code **)(lVar5 + 0x1360))(0xde1,0x2801,0x2600);
  (**(code **)(lVar5 + 0x1360))(0xde1,0x2800,0x2600);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"Set texturing state",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fTextureFormatTests.cpp"
                  ,0x1d9);
  pvVar9 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_90,0);
  deqp::gls::TextureTestUtil::TextureRenderer::renderQuad(&this->m_renderer,0,pvVar9,TEXTURETYPE_2D)
  ;
  context = this->m_renderCtx;
  tcu::Surface::getAccess
            ((PixelBufferAccess *)&refParams.baseLevel,(Surface *)&referenceFrame.m_pixels.m_cap);
  glu::readPixels(context,(int)renderedFrame.m_pixels.m_cap,renderedFrame.m_pixels.m_cap._4_4_,
                  (PixelBufferAccess *)&refParams.baseLevel);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"glReadPixels()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fTextureFormatTests.cpp"
                  ,0x1de);
  glu::TextureTestUtil::ReferenceParams::ReferenceParams
            ((ReferenceParams *)local_15c,TEXTURETYPE_2D);
  tcu::Vector<float,_4>::Vector(&local_1a8,0.0,0.0,0.0,0.0);
  tcu::Sampler::Sampler
            (&local_198,CLAMP_TO_EDGE,CLAMP_TO_EDGE,CLAMP_TO_EDGE,NEAREST,NEAREST,0.0,true,
             COMPAREMODE_NONE,0,&local_1a8,false,MODE_DEPTH);
  tcu::Sampler::operator=((Sampler *)(refParams.super_RenderParams.colorBias.m_data + 2),&local_198)
  ;
  iVar3 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  pPVar8 = tcu::RenderTarget::getPixelFormat((RenderTarget *)CONCAT44(extraout_var_02,iVar3));
  tcu::SurfaceAccess::SurfaceAccess(&local_1c8,(Surface *)local_60,pPVar8);
  pTVar6 = glu::Texture2D::getRefTexture(this->m_texture);
  TVar10 = tcu::Texture2D::operator_cast_to_Texture2DView(pTVar6);
  local_1d0 = TVar10.m_levels;
  local_1d8._0_4_ = TVar10.m_numLevels;
  pvVar9 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_90,0);
  glu::TextureTestUtil::sampleTexture
            (&local_1c8,(Texture2DView *)local_1d8,pvVar9,(ReferenceParams *)local_15c);
  bVar2 = glu::TextureTestUtil::compareImages
                    (log_00,(Surface *)local_60,(Surface *)&referenceFrame.m_pixels.m_cap,
                     threshold_00);
  pcVar7 = "Image comparison failed";
  if (bVar2) {
    pcVar7 = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestNode.m_testCtx,(byte)~bVar2 & QP_TEST_RESULT_FAIL,
             pcVar7);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)local_90);
  tcu::Surface::~Surface((Surface *)local_60);
  tcu::Surface::~Surface((Surface *)&referenceFrame.m_pixels.m_cap);
  return STOP;
}

Assistant:

Compressed2DFormatCase::IterateResult Compressed2DFormatCase::iterate (void)
{
	const glw::Functions&	gl					= m_renderCtx.getFunctions();
	TestLog&				log					= m_testCtx.getLog();
	RandomViewport			viewport			(m_renderCtx.getRenderTarget(), m_texture->getRefTexture().getWidth(), m_texture->getRefTexture().getHeight(), deStringHash(getName()));
	tcu::Surface			renderedFrame		(viewport.width, viewport.height);
	tcu::Surface			referenceFrame		(viewport.width, viewport.height);
	tcu::RGBA				threshold			= m_renderCtx.getRenderTarget().getPixelFormat().getColorThreshold() + tcu::RGBA(1,1,1,1);
	vector<float>			texCoord;

	computeQuadTexCoord2D(texCoord, tcu::Vec2(0.0f, 0.0f), tcu::Vec2(1.0f, 1.0f));

	// Setup base viewport.
	gl.viewport(viewport.x, viewport.y, viewport.width, viewport.height);

	// Bind to unit 0.
	gl.activeTexture(GL_TEXTURE0);
	gl.bindTexture(GL_TEXTURE_2D, m_texture->getGLTexture());

	// Setup nearest neighbor filtering and clamp-to-edge.
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S,		GL_CLAMP_TO_EDGE);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T,		GL_CLAMP_TO_EDGE);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER,	GL_NEAREST);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER,	GL_NEAREST);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Set texturing state");

	// Draw.
	m_renderer.renderQuad(0, &texCoord[0], TEXTURETYPE_2D);
	glu::readPixels(m_renderCtx, viewport.x, viewport.y, renderedFrame.getAccess());
	GLU_EXPECT_NO_ERROR(gl.getError(), "glReadPixels()");

	// Compute reference.
	ReferenceParams refParams(TEXTURETYPE_2D);
	refParams.sampler = Sampler(Sampler::CLAMP_TO_EDGE, Sampler::CLAMP_TO_EDGE, Sampler::CLAMP_TO_EDGE, Sampler::NEAREST, Sampler::NEAREST);
	sampleTexture(tcu::SurfaceAccess(referenceFrame, m_renderCtx.getRenderTarget().getPixelFormat()), m_texture->getRefTexture(), &texCoord[0], refParams);

	// Compare and log.
	bool isOk = compareImages(log, referenceFrame, renderedFrame, threshold);

	m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
							isOk ? "Pass"				: "Image comparison failed");

	return STOP;
}